

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  SyntaxNode *args_2;
  BinaryConditionalDirectiveExpressionSyntax *pBVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_30,
                    (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_2 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x30),&local_31,(BumpAllocator *)__child_stack);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinaryConditionalDirectiveExpressionSyntax,slang::syntax::ConditionalDirectiveExpressionSyntax&,slang::parsing::Token,slang::syntax::ConditionalDirectiveExpressionSyntax&>
                     ((BumpAllocator *)__child_stack,(ConditionalDirectiveExpressionSyntax *)args,
                      &local_30,(ConditionalDirectiveExpressionSyntax *)args_2);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinaryConditionalDirectiveExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinaryConditionalDirectiveExpressionSyntax>(
        *deepClone<ConditionalDirectiveExpressionSyntax>(*node.left, alloc),
        node.op.deepClone(alloc),
        *deepClone<ConditionalDirectiveExpressionSyntax>(*node.right, alloc)
    );
}